

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O3

Sto_Cls_t * Int_ManPropagate(Int_Man_t *p,int Start)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Sto_Cls_t **ppSVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  Sto_Cls_t **ppSVar9;
  uint uVar10;
  long lVar11;
  lit *plVar12;
  uint uVar13;
  uint uVar14;
  Sto_Cls_t *pSVar15;
  undefined1 auVar16 [16];
  timespec ts;
  timespec local_38;
  
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar4 = p->nTrailSize;
  if (iVar4 <= Start) {
LAB_0054ba34:
    iVar4 = clock_gettime(3,&local_38);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    pSVar15 = (Sto_Cls_t *)0x0;
LAB_0054bab4:
    p->timeBcp = p->timeBcp + lVar5 + lVar8;
    return pSVar15;
  }
  lVar5 = (long)Start;
LAB_0054b8b3:
  uVar7 = p->pTrail[lVar5];
  pSVar15 = p->pWatches[(int)uVar7];
  if (pSVar15 != (Sto_Cls_t *)0x0) {
    uVar6 = uVar7 ^ 1;
    ppSVar9 = p->pWatches + (int)uVar7;
LAB_0054b8d8:
    uVar7 = *(uint *)&pSVar15[1].pNext;
    uVar13 = *(uint *)((long)&pSVar15[1].pNext + 4);
    if (uVar7 == uVar6) {
      *(uint *)&pSVar15[1].pNext = uVar13;
      *(uint *)((long)&pSVar15[1].pNext + 4) = uVar6;
      uVar1 = pSVar15->pNext0;
      uVar2 = pSVar15->pNext1;
      auVar16._8_4_ = (int)uVar1;
      auVar16._0_8_ = uVar2;
      auVar16._12_4_ = (int)((ulong)uVar1 >> 0x20);
      pSVar15->pNext0 = (Sto_Cls_t *)uVar2;
      pSVar15->pNext1 = (Sto_Cls_t *)auVar16._8_8_;
      uVar7 = uVar13;
    }
    else if (uVar13 != uVar6) {
      __assert_fail("pCur->pLits[1] == LitF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,0x1e3,"Sto_Cls_t *Int_ManPropagateOne(Int_Man_t *, lit)");
    }
    plVar12 = p->pAssigns;
    iVar4 = (int)uVar7 >> 1;
    uVar13 = plVar12[iVar4];
    if (uVar7 != uVar13) {
      uVar14 = *(uint *)&pSVar15->field_0x1c >> 3 & 0xffffff;
      uVar10 = 2;
      if (uVar14 < 3) {
LAB_0054b9d0:
        if (uVar14 <= uVar10) {
          plVar12 = p->pAssigns;
          uVar13 = plVar12[iVar4];
          goto LAB_0054b9dd;
        }
        goto LAB_0054ba16;
      }
      lVar11 = 0;
      do {
        uVar10 = *(uint *)((long)&pSVar15[1].pNext0 + lVar11 * 4);
        if ((plVar12[(int)uVar10 >> 1] ^ uVar10) != 1) {
          *(uint *)((long)&pSVar15[1].pNext + 4) = uVar10;
          *(uint *)((long)&pSVar15[1].pNext0 + lVar11 * 4) = uVar6;
          *ppSVar9 = pSVar15->pNext1;
          uVar13 = *(uint *)((long)&pSVar15[1].pNext + 4);
          if (((int)uVar13 < 0) || (p->pCnf->nVars <= (int)(uVar13 >> 1))) {
            __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                          ,0x189,"void Int_ManWatchClause(Int_Man_t *, Sto_Cls_t *, lit)");
          }
          uVar10 = (int)lVar11 + 2;
          ppSVar3 = p->pWatches;
          (&pSVar15->pNext0)[uVar7 != uVar13] = ppSVar3[(ulong)uVar13 ^ 1];
          ppSVar3[(ulong)uVar13 ^ 1] = pSVar15;
          uVar14 = *(uint *)&pSVar15->field_0x1c >> 3 & 0xffffff;
          goto LAB_0054b9d0;
        }
        lVar11 = lVar11 + 1;
      } while ((ulong)uVar14 - 2 != lVar11);
LAB_0054b9dd:
      if (uVar13 == 0xffffffff) {
        plVar12[iVar4] = uVar7;
        p->pReasons[iVar4] = pSVar15;
        iVar4 = p->nTrailSize;
        p->nTrailSize = iVar4 + 1;
        p->pTrail[iVar4] = uVar7;
        goto LAB_0054ba0f;
      }
      if (uVar13 != uVar7) {
        iVar4 = clock_gettime(3,&local_38);
        if (iVar4 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
        }
        goto LAB_0054bab4;
      }
    }
LAB_0054ba0f:
    ppSVar9 = &pSVar15->pNext1;
LAB_0054ba16:
    pSVar15 = *ppSVar9;
    if (pSVar15 == (Sto_Cls_t *)0x0) goto code_r0x0054ba22;
    goto LAB_0054b8d8;
  }
  goto LAB_0054ba25;
code_r0x0054ba22:
  iVar4 = p->nTrailSize;
LAB_0054ba25:
  lVar5 = lVar5 + 1;
  if (iVar4 <= lVar5) goto LAB_0054ba34;
  goto LAB_0054b8b3;
}

Assistant:

Sto_Cls_t * Int_ManPropagate( Int_Man_t * p, int Start )
{
    Sto_Cls_t * pClause;
    int i;
    abctime clk = Abc_Clock();
    for ( i = Start; i < p->nTrailSize; i++ )
    {
        pClause = Int_ManPropagateOne( p, p->pTrail[i] );
        if ( pClause )
        {
p->timeBcp += Abc_Clock() - clk;
            return pClause;
        }
    }
p->timeBcp += Abc_Clock() - clk;
    return NULL;
}